

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node(lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,uint16_t inherited_flags,
                       ly_set *child_set)

{
  uint16_t uVar1;
  uint32_t uVar2;
  LY_ERR LVar3;
  char *pcVar4;
  lys_module *local_68;
  _func_LY_ERR_lysc_ctx_ptr_lysp_node_ptr_lysc_node_ptr *local_58;
  _func_LY_ERR_lysc_ctx_ptr_lysp_node_ptr_lysc_node_ptr *node_compile_spec;
  lysc_node *plStack_48;
  uint32_t prev_opts;
  lysc_node *node;
  LY_ERR ret;
  ly_set *child_set_local;
  uint16_t inherited_flags_local;
  lysc_node *parent_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  uVar2 = ctx->compile_opts;
  if (pnode->nodetype == 0x800) {
    lysc_update_path(ctx,(lys_module *)0x0,"{uses}");
    lysc_update_path(ctx,(lys_module *)0x0,pnode->name);
  }
  else {
    if (parent == (lysc_node *)0x0) {
      local_68 = (lys_module *)0x0;
    }
    else {
      local_68 = parent->module;
    }
    lysc_update_path(ctx,local_68,pnode->name);
  }
  uVar1 = pnode->nodetype;
  if (uVar1 == 1) {
    plStack_48 = (lysc_node *)calloc(1,0x78);
    local_58 = lys_compile_node_container;
  }
  else if (uVar1 == 2) {
    plStack_48 = (lysc_node *)calloc(1,0x68);
    local_58 = lys_compile_node_choice;
  }
  else if (uVar1 == 4) {
    plStack_48 = (lysc_node *)calloc(1,0x78);
    local_58 = lys_compile_node_leaf;
  }
  else if (uVar1 == 8) {
    plStack_48 = (lysc_node *)calloc(1,0x80);
    local_58 = lys_compile_node_leaflist;
  }
  else if (uVar1 == 0x10) {
    plStack_48 = (lysc_node *)calloc(1,0x88);
    local_58 = lys_compile_node_list;
  }
  else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
    plStack_48 = (lysc_node *)calloc(1,0x60);
    local_58 = lys_compile_node_any;
  }
  else if (uVar1 == 0x80) {
    plStack_48 = (lysc_node *)calloc(1,0x60);
    local_58 = lys_compile_node_case;
  }
  else if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
    if ((ctx->compile_opts & 0x7000) != 0) {
      pcVar4 = "another RPC/action";
      if ((ctx->compile_opts & 0x4000) != 0) {
        pcVar4 = "notification";
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Action \"%s\" is placed inside %s.",pnode->name,
              pcVar4);
      return LY_EVALID;
    }
    plStack_48 = (lysc_node *)calloc(1,0x118);
    local_58 = lys_compile_node_action;
    ctx->compile_opts = ctx->compile_opts | 4;
  }
  else {
    if (uVar1 != 0x400) {
      if (uVar1 != 0x800) {
        ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
               ,0x10d7);
        return LY_EINT;
      }
      LVar3 = lys_compile_uses(ctx,(lysp_node_uses *)pnode,parent,inherited_flags,child_set);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      return LVar3;
    }
    if ((ctx->compile_opts & 0x7000) != 0) {
      pcVar4 = "RPC/action";
      if ((ctx->compile_opts & 0x4000) != 0) {
        pcVar4 = "another notification";
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Notification \"%s\" is placed inside %s.",
              pnode->name,pcVar4);
      return LY_EVALID;
    }
    plStack_48 = (lysc_node *)calloc(1,0x68);
    local_58 = lys_compile_node_notif;
    ctx->compile_opts = ctx->compile_opts | 0x4004;
  }
  if (plStack_48 == (lysc_node *)0x0) {
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    ctx_local._4_4_ =
         lys_compile_node_(ctx,pnode,parent,inherited_flags,local_58,plStack_48,child_set);
    ctx->compile_opts = uVar2;
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lys_compile_node(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *parent, uint16_t inherited_flags,
        struct ly_set *child_set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node = NULL;
    uint32_t prev_opts = ctx->compile_opts;

    LY_ERR (*node_compile_spec)(struct lysc_ctx *, struct lysp_node *, struct lysc_node *);

    if (pnode->nodetype != LYS_USES) {
        lysc_update_path(ctx, parent ? parent->module : NULL, pnode->name);
    } else {
        lysc_update_path(ctx, NULL, "{uses}");
        lysc_update_path(ctx, NULL, pnode->name);
    }

    switch (pnode->nodetype) {
    case LYS_CONTAINER:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_container));
        node_compile_spec = lys_compile_node_container;
        break;
    case LYS_LEAF:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_leaf));
        node_compile_spec = lys_compile_node_leaf;
        break;
    case LYS_LIST:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_list));
        node_compile_spec = lys_compile_node_list;
        break;
    case LYS_LEAFLIST:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_leaflist));
        node_compile_spec = lys_compile_node_leaflist;
        break;
    case LYS_CHOICE:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_choice));
        node_compile_spec = lys_compile_node_choice;
        break;
    case LYS_CASE:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_case));
        node_compile_spec = lys_compile_node_case;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_anydata));
        node_compile_spec = lys_compile_node_any;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (ctx->compile_opts & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                    "Action \"%s\" is placed inside %s.", pnode->name,
                    (ctx->compile_opts & LYS_IS_NOTIF) ? "notification" : "another RPC/action");
            return LY_EVALID;
        }
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_action));
        node_compile_spec = lys_compile_node_action;
        ctx->compile_opts |= LYS_COMPILE_NO_CONFIG;
        break;
    case LYS_NOTIF:
        if (ctx->compile_opts & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                    "Notification \"%s\" is placed inside %s.", pnode->name,
                    (ctx->compile_opts & LYS_IS_NOTIF) ? "another notification" : "RPC/action");
            return LY_EVALID;
        }
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_notif));
        node_compile_spec = lys_compile_node_notif;
        ctx->compile_opts |= LYS_COMPILE_NOTIFICATION;
        break;
    case LYS_USES:
        ret = lys_compile_uses(ctx, (struct lysp_node_uses *)pnode, parent, inherited_flags, child_set);
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
        return ret;
    default:
        LOGINT(ctx->ctx);
        return LY_EINT;
    }
    LY_CHECK_ERR_RET(!node, LOGMEM(ctx->ctx), LY_EMEM);

    ret = lys_compile_node_(ctx, pnode, parent, inherited_flags, node_compile_spec, node, child_set);

    ctx->compile_opts = prev_opts;
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}